

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O2

void Cnf_ManPostprocess_old(Cnf_Man_t *p)

{
  Vec_Ptr_t *p_00;
  uint uVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int i;
  
  uVar4 = 0;
  uVar5 = 0;
  i = 0;
  do {
    p_00 = p->pManAig->vObjs;
    if (p_00->nSize <= i) {
      printf("Total gain = %d.  Vars = %d.\n",(ulong)uVar5,(ulong)uVar4);
      return;
    }
    pvVar2 = Vec_PtrEntry(p_00,i);
    if (((pvVar2 != (void *)0x0) && ((*(ulong *)((long)pvVar2 + 0x18) & 0xffffffc0) != 0)) &&
       (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7)) {
      for (uVar6 = 0; uVar6 < _DAT_00000004 >> 0x1d; uVar6 = uVar6 + 1) {
        pAVar3 = Aig_ManObj(p->pManAig,*(int *)(uVar6 * 4 + 8));
        uVar1 = *(uint *)&pAVar3->field_0x18;
        if (0xfffffffd < (uVar1 & 7) - 7) {
          if (uVar1 < 0x40) {
            __assert_fail("pFan->nRefs != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfPost.c"
                          ,0x42,"void Cnf_ManPostprocess_old(Cnf_Man_t *)");
          }
          if (((uVar1 & 0xffffffc0) == 0x40) && (uVar1 = _DAT_00000004 >> 0xf & 0xffe, uVar1 != 0))
          {
            uVar5 = uVar5 + uVar1;
            uVar4 = uVar4 + 1;
          }
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cnf_ManPostprocess_old( Cnf_Man_t * p )
{
//    extern int Aig_ManLargeCutEval( Aig_Man_t * p, Aig_Obj_t * pRoot, Dar_Cut_t * pCutR, Dar_Cut_t * pCutL, int Leaf );
    int nNew, Gain, nGain = 0, nVars = 0;

    Aig_Obj_t * pObj, * pFan;
    Dar_Cut_t * pCutBest, * pCut;
    int i, k;//, a, b, Counter;
    Aig_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        if ( pObj->nRefs == 0 )
            continue;
//        pCutBest = Aig_ObjBestCut(pObj);
        pCutBest = NULL;

        Dar_CutForEachLeaf( p->pManAig, pCutBest, pFan, k )
        {
            if ( !Aig_ObjIsNode(pFan) )
                continue;
            assert( pFan->nRefs != 0 );
            if ( pFan->nRefs != 1 )
                continue;
//            pCut = Aig_ObjBestCut(pFan);
            pCut = NULL;
/*
            // find how many common variable they have
            Counter = 0;
            for ( a = 0; a < (int)pCut->nLeaves; a++ )
            {
                for ( b = 0; b < (int)pCutBest->nLeaves; b++ )
                    if ( pCut->pLeaves[a] == pCutBest->pLeaves[b] )
                        break;
                if ( b == (int)pCutBest->nLeaves )
                    continue;
                Counter++;
            }
            printf( "%d ", Counter );
*/
            // find the new truth table after collapsing these two cuts


//            nNew = Aig_ManLargeCutEval( p->pManAig, pObj, pCutBest, pCut, pFan->Id );
            nNew = 0;


//            printf( "%d+%d=%d:%d(%d) ", pCutBest->Cost, pCut->Cost, 
//                pCutBest->Cost+pCut->Cost, nNew, pCutBest->Cost+pCut->Cost-nNew );

            Gain = pCutBest->Value + pCut->Value - nNew;
            if ( Gain > 0 )
            {
                nGain += Gain;
                nVars++;
            }
        }
    }
    printf( "Total gain = %d.  Vars = %d.\n", nGain, nVars );
}